

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + message->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  (*this->_vptr_AbstractSocketWriter[2])(this,local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void SendLn(const string& message) {
      Send(message + "\n");
    }